

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall
JetHead::ServerSocket::processFileEvents
          (ServerSocket *this,int fd,short events,jh_ptr_int_t private_data)

{
  SocketListener *pSVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  sockaddr *__addr;
  Socket *newSock;
  bool accepted;
  jh_ptr_int_t private_data_local;
  short events_local;
  int fd_local;
  ServerSocket *this_local;
  long *plVar5;
  
  if ((events & 1U) != 0) {
    bVar2 = Socket::isSockStream(&this->super_Socket);
    if (bVar2) {
      newSock._7_1_ = 0;
      iVar4 = accept(this,fd,__addr,(socklen_t *)private_data);
      plVar5 = (long *)CONCAT44(extraout_var,iVar4);
      if (plVar5 != (long *)0x0) {
        if ((this->super_Socket).mListener != (SocketListener *)0x0) {
          pSVar1 = (this->super_Socket).mListener;
          bVar3 = (**(code **)(*(long *)pSVar1 + 0x18))(pSVar1,this,plVar5);
          newSock._7_1_ = bVar3 & 1;
        }
        if ((newSock._7_1_ == 0) && ((**(code **)(*plVar5 + 0x28))(), plVar5 != (long *)0x0)) {
          (**(code **)(*plVar5 + 0x10))();
        }
      }
    }
    else if ((this->super_Socket).mListener != (SocketListener *)0x0) {
      (**(code **)(*(long *)(this->super_Socket).mListener + 8))();
    }
  }
  return;
}

Assistant:

void ServerSocket::processFileEvents( int fd, short events, jh_ptr_int_t private_data )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	if ( events & POLLIN )
	{
		if ( isSockStream() )
		{
			bool accepted = false;
			
			// Call accept to initialize the new socket
			Socket *newSock = accept();
			
			if (newSock != NULL)
			{
				// Check if the listener wishes to accept this connection
				if (mListener != NULL)
					accepted = mListener->handleAccept(this, newSock);
				
				// If the listener does not accept the new connection then
				// close and destroy it.
				if (not accepted)
				{
					newSock->close();
					delete newSock;
				}
			}
		}
		else
		{
			if ( mListener != NULL )
			{
				mListener->handleData( this );
			}
		}
	}
}